

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O0

void hrec_add_idx(bcf_hrec_t *hrec,int idx)

{
  char **ppcVar1;
  char *pcVar2;
  undefined1 local_30 [8];
  kstring_t str;
  int n;
  int idx_local;
  bcf_hrec_t *hrec_local;
  
  str.s._0_4_ = hrec->nkeys + 1;
  hrec->nkeys = (int)str.s;
  str.s._4_4_ = idx;
  ppcVar1 = (char **)realloc(hrec->keys,(long)(int)str.s << 3);
  hrec->keys = ppcVar1;
  ppcVar1 = (char **)realloc(hrec->vals,(long)(int)str.s << 3);
  hrec->vals = ppcVar1;
  pcVar2 = strdup("IDX");
  hrec->keys[(int)str.s + -1] = pcVar2;
  memset(local_30,0,0x18);
  kputw(str.s._4_4_,(kstring_t *)local_30);
  hrec->vals[(int)str.s + -1] = (char *)str.m;
  return;
}

Assistant:

void hrec_add_idx(bcf_hrec_t *hrec, int idx)
{
    int n = ++hrec->nkeys;
    hrec->keys = (char**) realloc(hrec->keys, sizeof(char*)*n);
    hrec->vals = (char**) realloc(hrec->vals, sizeof(char*)*n);
    hrec->keys[n-1] = strdup("IDX");
    kstring_t str = {0,0,0};
    kputw(idx, &str);
    hrec->vals[n-1] = str.s;
}